

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O3

MppTrieInfo * mpp_trie_get_info_from_root(void *root,char *name)

{
  MppTrieNode *pMVar1;
  MppTrieInfo *pMVar2;
  
  if (root == (void *)0x0 || name == (char *)0x0) {
    pMVar2 = (MppTrieInfo *)0x0;
    _mpp_log_l(2,"mpp_trie","invalid root %p name %p\n","mpp_trie_get_info_from_root",root);
  }
  else {
    pMVar1 = mpp_trie_get_node((MppTrieNode *)root,name);
    if ((pMVar1 == (MppTrieNode *)0x0) || ((long)pMVar1->id < 0)) {
      pMVar2 = (MppTrieInfo *)0x0;
    }
    else {
      pMVar2 = (MppTrieInfo *)((long)root + (long)pMVar1->id);
    }
  }
  return pMVar2;
}

Assistant:

MppTrieInfo *mpp_trie_get_info_from_root(void *root, const char *name)
{
    MppTrieNode *node;

    if (!root || !name) {
        mpp_loge_f("invalid root %p name %p\n", root, name);
        return NULL;
    }

    node = mpp_trie_get_node((MppTrieNode *)root, name);
    if (!node || node->id < 0)
        return NULL;

    return (MppTrieInfo *)(((char *)root) + node->id);
}